

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_parser.h
# Opt level: O1

string * __thiscall
sentencepiece::PrintProto_abi_cxx11_
          (string *__return_storage_ptr__,sentencepiece *this,NormalizerSpec *message,
          string_view name)

{
  ostream *poVar1;
  ostringstream os;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(char *)name._M_len,(long)message);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," {\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"name",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,": ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,*(char **)(*(ulong *)(this + 0x30) & 0xfffffffffffffffe),
                      ((undefined8 *)(*(ulong *)(this + 0x30) & 0xfffffffffffffffe))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"add_dummy_prefix",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,": ",2);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(local_1a0,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"remove_extra_whitespaces",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,": ",2);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(local_1a0,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"escape_whitespaces",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,": ",2);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(local_1a0,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"  ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"normalization_rule_tsv",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,": ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,*(char **)(*(ulong *)(this + 0x40) & 0xfffffffffffffffe),
                      ((undefined8 *)(*(ulong *)(this + 0x40) & 0xfffffffffffffffe))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

inline std::string PrintProto(const NormalizerSpec &message,
                              absl::string_view name) {
  std::ostringstream os;

  os << name << " {\n";

  PRINT_PARAM(name);
  PRINT_PARAM(add_dummy_prefix);
  PRINT_PARAM(remove_extra_whitespaces);
  PRINT_PARAM(escape_whitespaces);
  PRINT_PARAM(normalization_rule_tsv);

  os << "}\n";

  return os.str();
}